

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

void insert<16384u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *root,uchar **strings
               ,size_t n)

{
  pointer pppuVar1;
  pointer ppvVar2;
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *this;
  vector_bagwell<unsigned_char_*,_16U> *this_00;
  TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> *pTVar3;
  byte bVar4;
  uint index;
  size_t depth;
  long lVar6;
  size_t sVar7;
  uchar *str;
  BurstSimple<unsigned_char> local_49;
  byte *local_48;
  size_t local_40;
  uchar **local_38;
  ulong uVar5;
  
  if (n != 0) {
    sVar7 = 0;
    local_40 = n;
    local_38 = strings;
    do {
      local_48 = local_38[sVar7];
      if (local_48 == (byte *)0x0) {
LAB_0020e8b7:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar4 = *local_48;
      uVar5 = (ulong)bVar4;
      index = (uint)bVar4;
      ppvVar2 = (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      depth = 1;
      this = root;
      if (uVar5 < (ulong)((long)(root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3)) {
        lVar6 = 0;
        do {
          if (((ulong)ppvVar2[uVar5] & 1) == 0) break;
          if (bVar4 == 0) {
            __assert_fail("not is_end(c)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xeb,
                          "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_bagwell<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                         );
          }
          this = TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_>::get_node
                           (this,(uint)uVar5);
          if (local_48 == (byte *)0x0) goto LAB_0020e8b7;
          bVar4 = local_48[lVar6 + 1];
          lVar6 = lVar6 + 1;
          uVar5 = (ulong)bVar4;
          ppvVar2 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar5 < (ulong)((long)(this->_buckets).
                                       super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3));
        index = (uint)uVar5;
        depth = lVar6 + 1;
      }
      this_00 = TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_>::get_bucket
                          (this,index);
      if (this_00 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
        __assert_fail("bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xf1,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_bagwell<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      vector_bagwell<unsigned_char_*,_16U>::push_back(this_00,&local_48);
      if (((bVar4 != 0) && (this_00->_insertpos != (uchar **)0x0)) &&
         (pppuVar1 = (this_00->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_finish,
         0x20000 < (ulong)((long)this_00->_insertpos +
                          ((long)((1 << ((char)((uint)((int)pppuVar1 -
                                                      *(int *)&(this_00->_index_block).
                                                                                                                              
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                         3U & 0x1f)) + -0x10) * 8 - (long)pppuVar1[-1])))) {
        pTVar3 = BurstSimple<unsigned_char>::operator()(&local_49,this_00,depth);
        *(TrieNode<unsigned_char,_vector_bagwell<unsigned_char_*,_16U>_> **)
         ((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + (ulong)((uint)bVar4 * 8)) = pTVar3;
        ppvVar2 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar5 = *(ulong *)((long)ppvVar2 + (ulong)((uint)bVar4 * 8));
        if (uVar5 == 0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x5c,"void make_trie(void *&)");
        }
        ppvVar2[bVar4] = (void *)(uVar5 | 1);
        vector_bagwell<unsigned_char_*,_16U>::~vector_bagwell(this_00);
        operator_delete(this_00);
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != local_40);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT, BucketT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT, BucketT>* node = root;
		while (node->is_trie(c)) {
			assert(not is_end(c));
			node = node->get_node(c);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = node->get_bucket(c);
		assert(bucket);
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->_buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			make_trie(node->_buckets[c]);
			delete bucket;
		}
	}
}